

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O1

ExtensionInitResult *
duckdb::ExtensionHelper::InitialLoad
          (ExtensionInitResult *__return_storage_ptr__,DatabaseInstance *db,FileSystem *fs,
          string *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  DBConfig *pDVar3;
  IOException *pIVar4;
  pointer *__ptr;
  string error;
  ExtensionInstallOptions options;
  ExtensionInstallInfo *local_88;
  string local_80;
  ExtensionInstallOptions local_60;
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->filebase)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filebase).field_2;
  (__return_storage_ptr__->filebase)._M_string_length = 0;
  (__return_storage_ptr__->filebase).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->abi_type = UNKNOWN;
  (__return_storage_ptr__->install_info).
  super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
       (ExtensionInstallInfo *)0x0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  bVar2 = TryInitialLoad(db,fs,extension,__return_storage_ptr__,&local_80);
  if (bVar2) {
LAB_01625ba3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  pDVar3 = DBConfig::GetConfig(db);
  if ((pDVar3->options).autoinstall_known_extensions == true) {
    bVar2 = AllowAutoInstall(extension);
    if (bVar2) {
      paVar1 = &local_60.version.field_2;
      local_60.repository.ptr = (ExtensionRepository *)0x0;
      local_60.version._M_string_length = 0;
      local_60.version.field_2._M_local_buf[0] = '\0';
      local_60.force_install = false;
      local_60.use_etags = false;
      local_60.throw_on_origin_mismatch = false;
      local_60.version._M_dataplus._M_p = (pointer)paVar1;
      InstallExtension((ExtensionHelper *)&local_88,db,fs,extension,&local_60);
      if (local_88 != (ExtensionInstallInfo *)0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&local_88,local_88);
      }
      local_88 = (ExtensionInstallInfo *)0x0;
      bVar2 = TryInitialLoad(db,fs,extension,__return_storage_ptr__,&local_80);
      if (!bVar2) {
        pIVar4 = (IOException *)__cxa_allocate_exception(0x10);
        IOException::IOException(pIVar4,(string *)&local_80);
        __cxa_throw(pIVar4,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.version._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.version._M_dataplus._M_p);
      }
      goto LAB_01625ba3;
    }
  }
  pIVar4 = (IOException *)__cxa_allocate_exception(0x10);
  IOException::IOException(pIVar4,(string *)&local_80);
  __cxa_throw(pIVar4,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ExtensionInitResult ExtensionHelper::InitialLoad(DatabaseInstance &db, FileSystem &fs, const string &extension) {
	string error;
	ExtensionInitResult result;
	if (!TryInitialLoad(db, fs, extension, result, error)) {
		auto &config = DBConfig::GetConfig(db);
		if (!config.options.autoinstall_known_extensions || !ExtensionHelper::AllowAutoInstall(extension)) {
			throw IOException(error);
		}
		// the extension load failed - try installing the extension
		ExtensionInstallOptions options;
		ExtensionHelper::InstallExtension(db, fs, extension, options);
		// try loading again
		if (!TryInitialLoad(db, fs, extension, result, error)) {
			throw IOException(error);
		}
	}
	return result;
}